

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O3

bool __thiscall cmDocumentation::PrintHelpOneModule(cmDocumentation *this,ostream *os)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  cmDocumentation *this_00;
  string mname;
  undefined1 local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pcVar1 = (this->CurrentArgument)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->CurrentArgument)._M_string_length);
  this_00 = (cmDocumentation *)local_60;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 "module/",&local_40);
  bVar2 = PrintFiles(this_00,os,(string *)local_60);
  if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Argument \"",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(this->CurrentArgument)._M_dataplus._M_p,
                        (this->CurrentArgument)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"\" to --help-module is not a CMake module.\n",0x2a);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmDocumentation::PrintHelpOneModule(std::ostream& os)
{
  std::string mname = this->CurrentArgument;
  if(this->PrintFiles(os, "module/" + mname))
    {
    return true;
    }
  // Argument was not a module.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-module is not a CMake module.\n";
  return false;
}